

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Progress.cxx
# Opt level: O0

void __thiscall Fl_Progress::Fl_Progress(Fl_Progress *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Progress *this_local;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,L);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Progress_002ed060;
  Fl_Widget::align(&this->super_Fl_Widget,0x10);
  Fl_Widget::box(&this->super_Fl_Widget,FL_DOWN_BOX);
  Fl_Widget::color(&this->super_Fl_Widget,7,0x5f);
  minimum(this,0.0);
  maximum(this,100.0);
  value(this,0.0);
  return;
}

Assistant:

Fl_Progress::Fl_Progress(int X, int Y, int W, int H, const char* L)
: Fl_Widget(X, Y, W, H, L) {
  align(FL_ALIGN_INSIDE);
  box(FL_DOWN_BOX);
  color(FL_BACKGROUND2_COLOR, FL_YELLOW);
  minimum(0.0f);
  maximum(100.0f);
  value(0.0f);
}